

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O0

void __thiscall QFbVtHandler::setKeyboardEnabled(QFbVtHandler *this,bool enable)

{
  int iVar1;
  byte in_SIL;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x10) != -1) {
    if ((in_SIL & 1) == 0) {
      ioctl(*(int *)(in_RDI + 0x10),0x4b44,in_RDI + 0x14);
      iVar1 = qEnvironmentVariableIntValue("QT_QPA_ENABLE_TERMINAL_KEYBOARD",(bool *)0x0);
      if (iVar1 == 0) {
        ioctl(*(int *)(in_RDI + 0x10),0x4b51,1);
        ioctl(*(int *)(in_RDI + 0x10),0x4b45,4);
      }
    }
    else {
      ioctl(*(int *)(in_RDI + 0x10),0x4b51,0);
      ioctl(*(int *)(in_RDI + 0x10),0x4b45,(ulong)*(uint *)(in_RDI + 0x14));
    }
  }
  return;
}

Assistant:

void QFbVtHandler::setKeyboardEnabled(bool enable)
{
#ifdef VTH_ENABLED
    if (m_tty == -1)
        return;

    if (enable) {
        ::ioctl(m_tty, KDSKBMUTE, 0);
        ::ioctl(m_tty, KDSKBMODE, m_oldKbdMode);
    } else {
        ::ioctl(m_tty, KDGKBMODE, &m_oldKbdMode);
        if (!qEnvironmentVariableIntValue("QT_QPA_ENABLE_TERMINAL_KEYBOARD")) {
            ::ioctl(m_tty, KDSKBMUTE, 1);
            ::ioctl(m_tty, KDSKBMODE, KBD_OFF_MODE);
        }
    }
#else
    Q_UNUSED(enable);
#endif
}